

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

int lest::repeat(text *opt,text *arg)

{
  int iVar1;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  int num;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  string local_58 [32];
  string local_38 [36];
  int local_14;
  
  std::__cxx11::string::string(local_38,(string *)in_RSI);
  iVar1 = stoi((text *)0x10961b);
  std::__cxx11::string::~string(local_38);
  local_14 = iVar1;
  iVar1 = indefinite(iVar1);
  if ((iVar1 == 0) && (local_14 < 0)) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::operator+(in_RSI,(char *)in_RDI);
    std::operator+(in_RSI,in_RDI);
    std::operator+(in_RSI,(char *)in_RDI);
    std::runtime_error::runtime_error(this,local_58);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return local_14;
}

Assistant:

inline int repeat( text opt, text arg )
{
    const int num = lest::stoi( arg );

    if ( indefinite( num ) || num >= 0 )
        return num;

    throw std::runtime_error( "expecting '-1' or positive number with option '" + opt + "', got '" + arg + "' (try option --help)" );
}